

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O0

EverCrypt_DRBG_state_s * EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)

{
  EverCrypt_DRBG_state_s *pEVar1;
  EverCrypt_DRBG_state_s *buf;
  uint32_t *ctr_3;
  uint8_t *v_3;
  uint8_t *k_3;
  uint32_t *ctr_2;
  uint8_t *v_2;
  uint8_t *k_2;
  uint32_t *ctr_1;
  uint8_t *v_1;
  uint8_t *k_1;
  uint32_t *ctr;
  uint8_t *v;
  uint8_t *k;
  EverCrypt_DRBG_state_s st;
  Spec_Hash_Definitions_hash_alg a_local;
  
  switch(a) {
  case '\x01':
    st._0_8_ = calloc(0x20,1);
    st.field_1.case_SHA1_s.k = (uint8_t *)calloc(0x20,1);
    st.field_1.case_SHA1_s.v = (uint8_t *)malloc(4);
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 0) = '\x01';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 1) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 2) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 3) = '\0';
    k = (uint8_t *)CONCAT71(k_2._1_7_,1);
    break;
  case '\x02':
    st._0_8_ = calloc(0x30,1);
    st.field_1.case_SHA1_s.k = (uint8_t *)calloc(0x30,1);
    st.field_1.case_SHA1_s.v = (uint8_t *)malloc(4);
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 0) = '\x01';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 1) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 2) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 3) = '\0';
    k = (uint8_t *)CONCAT71(k_3._1_7_,2);
    break;
  case '\x03':
    st._0_8_ = calloc(0x40,1);
    st.field_1.case_SHA1_s.k = (uint8_t *)calloc(0x40,1);
    st.field_1.case_SHA1_s.v = (uint8_t *)malloc(4);
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 0) = '\x01';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 1) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 2) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 3) = '\0';
    k = (uint8_t *)CONCAT71(buf._1_7_,3);
    break;
  case '\x04':
    st._0_8_ = calloc(0x14,1);
    st.field_1.case_SHA1_s.k = (uint8_t *)calloc(0x14,1);
    st.field_1.case_SHA1_s.v = (uint8_t *)malloc(4);
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 0) = '\x01';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 1) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 2) = '\0';
    *(uint8_t *)((long)st.field_1.case_SHA1_s.v + 3) = '\0';
    k = (uint8_t *)((ulong)k_1._1_7_ << 8);
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
            ,0xd4);
    exit(0xfd);
  }
  pEVar1 = (EverCrypt_DRBG_state_s *)malloc(0x20);
  *(uint8_t **)pEVar1 = k;
  (pEVar1->field_1).case_SHA1_s.k = (uint8_t *)st._0_8_;
  (pEVar1->field_1).case_SHA1_s.v = st.field_1.case_SHA1_s.k;
  (pEVar1->field_1).case_SHA1_s.reseed_counter = (uint32_t *)st.field_1.case_SHA1_s.v;
  return pEVar1;
}

Assistant:

EverCrypt_DRBG_state_s *EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)
{
  EverCrypt_DRBG_state_s st;
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA1_s,
              { .case_SHA1_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_256_s,
              { .case_SHA2_256_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_384_s,
              { .case_SHA2_384_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_512_s,
              { .case_SHA2_512_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  EverCrypt_DRBG_state_s
  *buf = (EverCrypt_DRBG_state_s *)KRML_HOST_MALLOC(sizeof (EverCrypt_DRBG_state_s));
  buf[0U] = st;
  return buf;
}